

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

ParseNodeClass * __thiscall
Parser::ParseClassDecl<true>
          (Parser *this,BOOL isDeclaration,LPCOLESTR pNameHint,uint32 *pHintLength,
          uint32 *pShortNameOffset)

{
  ushort *puVar1;
  Scanner_t *this_00;
  byte *pbVar2;
  BOOL BVar3;
  tokens tVar4;
  ThreadConfiguration *pTVar5;
  long lVar6;
  IdentPtr pIVar7;
  EncodedCharPtr puVar8;
  EncodedCharPtr puVar9;
  code *pcVar10;
  ushort flags;
  IdentPtr pMemberName;
  uint32 uVar11;
  bool bVar12;
  tokens tVar13;
  charcount_t cVar14;
  uint uVar15;
  ParseNodeType *pPVar16;
  ParseNodeFnc *pPVar17;
  ParseNodeBlock *pnodeBlock;
  BlockInfoStack *pBVar18;
  LPCWSTR pWVar19;
  undefined4 *puVar20;
  IdentPtr pIVar21;
  undefined6 uVar25;
  undefined8 extraout_RAX;
  IdentPtr pIVar22;
  LPCOLESTR pOVar23;
  ParseNodeBin *this_01;
  ParseNodeBin *pPVar24;
  undefined8 extraout_RAX_00;
  uint32 uVar26;
  char16_t *pcVar27;
  Parser *pPVar28;
  uint uVar29;
  byte bVar30;
  bool bVar31;
  uint uVar32;
  bool bVar33;
  bool bVar34;
  undefined1 local_228 [8];
  ArenaAllocator tempAllocator;
  RestorePoint beginClass;
  ParseNode **local_168;
  ParseNodePtr *lastMemberNodeRef;
  LPCOLESTR emptyHint_1;
  ushort *local_150;
  HashTbl *local_148;
  ParseNode *local_140;
  ParseNodePtr pnodeMembers;
  ParseNodePtr *ppnodeScopeSave;
  ParseNodePtr *ppnodeExprScopeSave;
  Token *local_120;
  undefined1 auStack_118 [8];
  RestorePoint beginStatic;
  State state;
  ParseNodePtr local_b8;
  size_t local_90;
  IdentPtr local_88;
  IdentPtr pidHint;
  ParseNodeStr *local_78;
  ParseNodePtr pnodeMemberName;
  LPCOLESTR local_68;
  LPCOLESTR pMemberNameHint;
  ParseNodeFnc *local_58;
  undefined4 local_50;
  uint32 local_4c;
  uint32 local_48;
  uint32 local_44;
  uint32 memberNameOffset;
  uint32 memberNameHintLength;
  uint local_38;
  undefined4 local_34;
  
  uVar15 = 0;
  local_140 = (ParseNodePtr)0x0;
  local_168 = (ParseNode **)0x0;
  local_4c = 0;
  if (pHintLength != (uint32 *)0x0) {
    local_4c = *pHintLength;
  }
  if (pShortNameOffset != (uint32 *)0x0) {
    uVar15 = *pShortNameOffset;
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_228,
             L"ClassMemberNames",
             (this->m_nodeAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.pageAllocator,OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
  pPVar16 = CreateNodeForOpT<(OpCode)86>(this);
  this_00 = &this->m_scan;
  emptyHint_1 = (LPCOLESTR)((this->m_scan).m_pchMinTok + -(long)(this->m_scan).m_pchBase);
  BVar3 = this->m_fUseStrictMode;
  this->m_fUseStrictMode = 1;
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  local_120 = (Token *)&this->m_token;
  if ((this->m_token).tk == tkID) {
    pnodeMemberName = (ParseNodePtr)Token::GetIdentifier(local_120,&(this->m_scan).m_htbl);
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  }
  else {
    if (isDeclaration != 0) {
      IdentifierExpectedError(this,(Token *)local_120);
      pPVar28 = this;
LAB_00e9b5ea:
      Error(pPVar28,-0x7ff5fc16,L"",L"");
    }
    pnodeMemberName = (ParseNodePtr)0x0;
  }
  if (((isDeclaration != 0) &&
      ((IdentPtr)pnodeMemberName == (this->wellKnownPropertyPids).arguments)) &&
     ((this->m_currentBlockInfo->pnodeBlock->field_0x5c & 3) == 1)) {
    pPVar17 = GetCurrentFunctionNode(this);
    puVar1 = &(pPVar17->super_ParseNode).grfpn;
    *(byte *)puVar1 = (byte)*puVar1 | 1;
  }
  if (isDeclaration == 0) {
    ppnodeExprScopeSave = (ParseNodePtr *)0x0;
  }
  else {
    ppnodeExprScopeSave =
         (ParseNodePtr *)CreateBlockScopedDeclNode(this,(IdentPtr)pnodeMemberName,knopLetDecl);
  }
  pnodeMembers = (ParseNodePtr)0x0;
  ppnodeScopeSave = (ParseNodePtr *)0x0;
  pnodeBlock = CreateBlockNode(this,Regular);
  pnodeBlock->scope = (Scope *)0x0;
  pBVar18 = PushBlockInfo(this,pnodeBlock);
  (pnodeBlock->super_ParseNodeStmt).grfnop = 0;
  *(ParseNodeBlock **)&(pBVar18->pstmt).field_0.field_1 = pnodeBlock;
  (pBVar18->pstmt).pLabelId = (LabelId *)0x0;
  (pBVar18->pstmt).pstmtOuter = this->m_pstmtCur;
  this->m_pstmtCur = &pBVar18->pstmt;
  pPVar28 = this;
  PushFuncBlockScope(this,pnodeBlock,(ParseNodePtr **)&pnodeMembers,&ppnodeScopeSave);
  pPVar16->pnodeBlock = pnodeBlock;
  if (pnodeMemberName == (ParseNodePtr)0x0) {
    pMemberNameHint = (LPCOLESTR)0x0;
  }
  else {
    pPVar28 = this;
    pMemberNameHint =
         (LPCOLESTR)CreateBlockScopedDeclNode(this,(IdentPtr)pnodeMemberName,knopConstDecl);
  }
  tVar4 = (this->m_token).tk;
  if (tVar4 == tkEXTENDS) {
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
    pPVar28 = this;
    local_b8 = ParseTerm<true>(this,1,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,(IdentToken *)0x0,
                               false,1,(BOOL *)0x0,(BOOL *)0x0,(bool *)0x0,(charcount_t *)0x0,
                               (bool *)0x0);
  }
  else {
    local_b8 = (ParseNodePtr)0x0;
  }
  if ((this->m_token).tk != tkLCurly) {
    Error(pPVar28,-0x7ff5fc10,L"",L"");
  }
  pWVar19 = GetParseType(this);
  local_150 = &pnodeMemberName[2].grfpn;
  pcVar27 = (char16_t *)local_150;
  if (pnodeMemberName == (ParseNodePtr)0x0) {
    pcVar27 = L"anonymous class";
  }
  Output::TraceWithFlush(ES6VerboseFlag,L"Parsing class (%s) : %s\n",pWVar19,pcVar27);
  tempAllocator.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
  _0_4_ = 0xffffffff;
  tempAllocator.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
  _4_4_ = 0xffffffff;
  Scanner<UTF8EncodingPolicyBase<false>_>::Capture
            (this_00,(RestorePoint *)
                     &tempAllocator.
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                      freeList);
  Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid(this_00);
  if (pMemberNameHint == (LPCOLESTR)0x0) {
    pidHint = (IdentPtr)0x0;
  }
  else {
    pidHint = *(IdentPtr *)(pMemberNameHint + 0xc);
  }
  local_148 = &(this->m_scan).m_htbl;
  _memberNameOffset = (Parser *)this_00;
  puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  local_58 = (ParseNodeFnc *)0x0;
  bVar12 = false;
  pPVar28 = _memberNameOffset;
  do {
    while (tVar13 = (this->m_token).tk, tVar13 == tkSColon) {
      Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar28);
    }
    if (tVar13 == tkSTATIC) {
      beginStatic.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
      beginStatic.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
      beginStatic.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
      auStack_118 = (undefined1  [8])&DAT_ffffffffffffffff;
      beginStatic.m_ichMinTok = 0xffffffff;
      beginStatic.m_ichMinLine = 0xffffffff;
      beginStatic._20_16_ = (undefined1  [16])0x0;
      beginStatic.m_fHadEol = -1;
      beginStatic._44_4_ = 0xffffffff;
      Scanner<UTF8EncodingPolicyBase<false>_>::Capture
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar28,(RestorePoint *)auStack_118);
      tVar13 = Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
                         ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar28);
      bVar31 = (this->m_token).tk != tkLParen;
      local_38 = CONCAT31((int3)(tVar13 >> 8),bVar31);
      if (!bVar31) {
        Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar28,(RestorePoint *)auStack_118);
      }
    }
    else {
      if (tVar13 == tkRCurly) {
        cVar14 = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok
                           ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar28);
        (pPVar16->super_ParseNode).ichLim = cVar14;
        puVar8 = (this->m_scan).m_currentCharacter;
        puVar9 = (this->m_scan).m_pchBase;
        if (!bVar12) {
          pWVar19 = GetParseType(this);
          pcVar27 = (char16_t *)local_150;
          if (pnodeMemberName == (ParseNodePtr)0x0) {
            pcVar27 = L"anonymous class";
          }
          Output::TraceWithFlush
                    (ES6VerboseFlag,L"Generating constructor (%s) : %s\n",pWVar19,pcVar27);
          beginStatic.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
          beginStatic.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
          beginStatic.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
          auStack_118 = (undefined1  [8])&DAT_ffffffffffffffff;
          beginStatic.m_ichMinTok = 0xffffffff;
          beginStatic.m_ichMinLine = 0xffffffff;
          beginStatic._20_16_ = (undefined1  [16])0x0;
          beginStatic.m_fHadEol = -1;
          beginStatic._44_4_ = 0xffffffff;
          Scanner<UTF8EncodingPolicyBase<false>_>::Capture
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)_memberNameOffset,
                     (RestorePoint *)auStack_118);
          Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)_memberNameOffset,
                     (RestorePoint *)
                     &tempAllocator.
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                      freeList);
          local_58 = GenerateEmptyConstructor<true>(this,local_b8 != (ParseNodePtr)0x0);
          if (pidHint == (IdentPtr)0x0) {
            if (local_4c < uVar15) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar20 = 1;
              bVar12 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                  ,0x2016,"(nameHintLength >= nameHintOffset)",
                                  "nameHintLength >= nameHintOffset");
              if (!bVar12) {
LAB_00e9b589:
                pcVar10 = (code *)invalidInstructionException();
                (*pcVar10)();
              }
              *puVar20 = 0;
            }
            local_58->hint = pNameHint;
            uVar26 = local_4c;
          }
          else {
            local_58->hint = (LPCOLESTR)&pidHint->field_0x22;
            uVar15 = 0;
            uVar26 = pidHint->m_cch;
          }
          local_58->hintLength = uVar26;
          local_58->hintOffset = uVar15;
          local_58->pid = pidHint;
          Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)_memberNameOffset,
                     (RestorePoint *)auStack_118);
        }
        local_58->cbStringMin = (size_t)emptyHint_1;
        local_58->cbStringLim = (long)puVar8 - (long)puVar9;
        PopFuncBlockScope(this,(ParseNodePtr *)pnodeMembers,ppnodeScopeSave);
        pPVar16->pnodeDeclName = (ParseNodeVar *)ppnodeExprScopeSave;
        pPVar16->pnodeName = (ParseNodeVar *)pMemberNameHint;
        pPVar16->pnodeConstructor = local_58;
        pPVar16->pnodeExtends = local_b8;
        pPVar16->pnodeMembers = local_140;
        pPVar16->isDefaultModuleExport = false;
        FinishParseBlock(this,pnodeBlock,true);
        this->m_fUseStrictMode = BVar3;
        Scanner<UTF8EncodingPolicyBase<false>_>::Scan
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)_memberNameOffset);
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
        ~ArenaAllocatorBase((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            local_228);
        return pPVar16;
      }
      local_38 = 0;
    }
    Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok
              ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar28);
    local_90 = (long)(this->m_scan).m_pchMinTok - (long)(this->m_scan).m_pchBase;
    bVar31 = false;
    local_78 = (ParseNodeStr *)0x0;
    local_88 = (IdentPtr)0x0;
    local_68 = (LPCOLESTR)0x0;
    local_44 = 0;
    local_48 = 0;
    if ((this->m_token).tk == tkID) {
      if (((((this->m_scan).field_0x508 & 0x10) == 0) &&
          (pIVar22 = (this->wellKnownPropertyPids).async,
          pIVar21 = Token::GetIdentifier(local_120,local_148), pIVar21 == pIVar22)) &&
         (((this->m_scriptContext->config).threadConfig)->m_ES7AsyncAwait == true)) {
        beginStatic.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
        beginStatic.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
        beginStatic.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
        auStack_118 = (undefined1  [8])&DAT_ffffffffffffffff;
        beginStatic.m_ichMinTok = 0xffffffff;
        beginStatic.m_ichMinLine = 0xffffffff;
        beginStatic._20_16_ = (undefined1  [16])0x0;
        beginStatic.m_fHadEol = -1;
        beginStatic._44_4_ = 0xffffffff;
        Scanner<UTF8EncodingPolicyBase<false>_>::Capture
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)_memberNameOffset,
                   (RestorePoint *)auStack_118);
        Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)_memberNameOffset);
        local_90 = (long)(this->m_scan).m_pchMinTok - (long)(this->m_scan).m_pchBase;
        Scanner<UTF8EncodingPolicyBase<false>_>::Scan
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)_memberNameOffset);
        bVar33 = (this->m_token).tk != tkLParen;
        bVar34 = (this->m_scan).m_fHadEol == 0;
        bVar31 = bVar34 && bVar33;
        if (!bVar34 || !bVar33) {
          Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)_memberNameOffset,
                     (RestorePoint *)auStack_118);
        }
      }
      else {
        bVar31 = false;
      }
    }
    pTVar5 = (this->m_scriptContext->config).threadConfig;
    bVar30 = (this->m_token).tk == tkStar & pTVar5->m_ES6Generators;
    uVar25 = (undefined6)((ulong)pTVar5 >> 0x10);
    local_50 = (undefined4)CONCAT62(uVar25,0x68);
    if (bVar30 == 1) {
      local_50 = (undefined4)CONCAT62(uVar25,0xe8);
      Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)_memberNameOffset);
    }
    pPVar28 = this;
    if (((this->m_token).tk == tkLBrack) &&
       (((this->m_scriptContext->config).threadConfig)->m_ES6ObjectLiterals == true)) {
      auStack_118 = (undefined1  [8])0x0;
      ParseComputedName<true>
                (this,(ParseNodePtr *)&local_78,(LPCOLESTR *)auStack_118,&local_68,&local_44,
                 &local_48);
      local_34 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      pIVar22 = (IdentPtr)0x0;
      bVar33 = false;
    }
    else {
      bVar33 = ((this->m_scan).field_0x508 & 0x10) == 0;
      pIVar22 = ParseClassPropertyName(this,&local_88);
      if (local_88 != (IdentPtr)0x0) {
        local_68 = (LPCOLESTR)&local_88->field_0x22;
        local_44 = local_88->m_cch;
      }
      local_34 = 0;
    }
    if (pIVar22 != (IdentPtr)0x0) {
      pPVar28 = this;
      local_78 = CreateStrNode(this,pIVar22);
    }
    if (pIVar22 == (this->wellKnownPropertyPids).constructor && (byte)local_38 == '\0') {
      if (bVar31 != false || bVar12) {
        Error(pPVar28,-0x7ff5fc16,L"",L"");
      }
      pOVar23 = pNameHint;
      uVar32 = local_4c;
      uVar29 = uVar15;
      if ((pMemberNameHint != (LPCOLESTR)0x0) &&
         (lVar6 = *(long *)(pMemberNameHint + 0xc), lVar6 != 0)) {
        uVar32 = *(uint *)(lVar6 + 0x18);
        pOVar23 = (LPCOLESTR)(lVar6 + 0x22);
        uVar29 = 0;
      }
      pPVar28 = this;
      local_58 = ParseFncDeclNoCheckScope<true>
                           (this,(ushort)local_50 | (ushort)(tVar4 != tkEXTENDS) << 0xb | 0x400,
                            (tVar4 != tkEXTENDS) + CallAndPropertyAllowed,pOVar23,true,false,true);
      if ((local_58->fncFlags & kFunctionIsGenerator) != kFunctionNone) {
        Error(pPVar28,-0x7ff5fbce,L"",L"");
      }
      if (uVar32 < uVar29) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar20 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                            ,0x1f82,"(constructorNameLength >= constructorShortNameHintOffset)",
                            "constructorNameLength >= constructorShortNameHintOffset");
        if (!bVar12) goto LAB_00e9b589;
        *puVar20 = 0;
      }
      local_58->hint = pOVar23;
      local_58->hintLength = uVar32;
      local_58->hintOffset = uVar29;
      if ((pMemberNameHint == (LPCOLESTR)0x0) ||
         (pIVar22 = *(IdentPtr *)(pMemberNameHint + 0xc), pIVar22 == (IdentPtr)0x0)) {
        pIVar22 = (this->wellKnownPropertyPids).constructor;
      }
      local_58->pid = pIVar22;
      local_58->fncFlags = local_58->fncFlags | (kFunctionHasHomeObj|kFunctionHasNonThisStmt);
      bVar12 = true;
      pPVar28 = _memberNameOffset;
    }
    else {
      beginStatic.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
      beginStatic.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
      beginStatic.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
      auStack_118 = (undefined1  [8])&DAT_ffffffffffffffff;
      beginStatic.m_ichMinTok = 0xffffffff;
      beginStatic.m_ichMinLine = 0xffffffff;
      beginStatic._20_16_ = (undefined1  [16])0x0;
      beginStatic.m_fHadEol = -1;
      beginStatic._44_4_ = 0xffffffff;
      pPVar28 = _memberNameOffset;
      Scanner<UTF8EncodingPolicyBase<false>_>::Capture
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)_memberNameOffset,
                 (RestorePoint *)auStack_118);
      if ((bVar33) &&
         ((pIVar22 == (this->wellKnownPropertyPids).get ||
          (pIVar22 == (this->wellKnownPropertyPids).set)))) {
        pPVar28 = _memberNameOffset;
        Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)_memberNameOffset);
      }
      tVar13 = (this->m_token).tk;
      pIVar21 = pIVar22;
      if (tVar13 == tkLParen) {
        pPVar28 = _memberNameOffset;
        Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)_memberNameOffset,
                   (RestorePoint *)auStack_118);
LAB_00e9b000:
        pIVar7 = local_88;
        if ((pIVar22 == (this->wellKnownPropertyPids).prototype & (byte)local_38) == 1) {
          Error(pPVar28,-0x7ff5fc16,L"",L"");
        }
        flags = (ushort)local_50;
        if (bVar31 != false) {
          flags = (ushort)local_50 | 0x100;
        }
        pOVar23 = (LPCOLESTR)&local_88->field_0x22;
        if (local_88 == (IdentPtr)0x0) {
          pOVar23 = (LPCOLESTR)0x0;
        }
        pPVar17 = ParseFncDeclNoCheckScope<true>(this,flags,PropertyAllowed,pOVar23,true,false,true)
        ;
        if ((byte)(bVar31 | bVar30 | (byte)local_34) == 1) {
          pPVar17->cbStringMin = local_90;
          pPVar17->cbStringLim = pPVar17->cbLim;
        }
        bVar31 = (bool)(byte)local_38;
        pPVar17->fncFlags =
             local_38 << 0x18 |
             pPVar17->fncFlags &
             (kFunctionHasAnyWriteToFormals|kFunctionIsDefaultModuleExport|kFunctionHasDirectSuper|
              kFunctionIsAsync|kFunctionIsDeclaredInParamScope|kFunctionAsmjsMode|
              kFunctionIsGenerator|kFunctionHasDefaultArguments|kFunctionIsGeneratedDefault|
              kFunctionHasHomeObj|kFunctionIsClassMember|kFunctionIsBaseClassConstructor|
              kFunctionIsClassConstructor|kFunctionIsMethod|kFunctionHasSuperReference|
              kFunctionHasNonSimpleParameterList|kFunctionChildCallsEval|kFunctionIsLambda|
              kFunctionHasWithStmt|kFunctionHasComputedName|kFunctionIsModule|
              kFunctionHasDestructuredParams|kFunctionStrictMode|kFunctionHasNonThisStmt|
              kFunctionIsAccessor|kFunctionHasReferenceableBuiltInArguments|
              kFunctionHasHeapArguments|kFunctionUsesArguments|kFunctionCallsEval|
              kFunctionDeclaration|kFunctionNested);
        if ((byte)local_34 != 0) {
          pbVar2 = (byte *)((long)&pPVar17->fncFlags + 1);
          *pbVar2 = *pbVar2 | 8;
        }
        pbVar2 = (byte *)((long)&pPVar17->fncFlags + 2);
        *pbVar2 = *pbVar2 | 0x20;
        this_01 = CreateBinNode(this,knopMember,&local_78->super_ParseNode,&pPVar17->super_ParseNode
                               );
        local_68 = ConstructFinalHintNode
                             (this,pidHint,pIVar7,(IdentPtr)0x0,bVar31,&local_44,&local_48,
                              SUB41(local_34,0),local_68);
      }
      else {
        if ((!bVar33) ||
           ((pIVar7 = (this->wellKnownPropertyPids).get, pIVar22 != pIVar7 &&
            (pIVar22 != (this->wellKnownPropertyPids).set)))) goto LAB_00e9b000;
        pPVar28 = this;
        if ((tVar13 == tkLBrack) &&
           (((this->m_scriptContext->config).threadConfig)->m_ES6ObjectLiterals == true)) {
          lastMemberNodeRef = (ParseNodePtr *)0x0;
          ParseComputedName<true>
                    (this,(ParseNodePtr *)&local_78,(LPCOLESTR *)&lastMemberNodeRef,&local_68,
                     &local_44,&local_48);
          local_34 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
        }
        else {
          pIVar21 = ParseClassPropertyName(this,&local_88);
        }
        if ((byte)local_38 == '\0') {
          if ((~bVar31 & pIVar21 != (this->wellKnownPropertyPids).constructor) == 0)
          goto LAB_00e9b5ea;
        }
        else if (bVar31 != false || pIVar21 == (this->wellKnownPropertyPids).prototype)
        goto LAB_00e9b5ea;
        if (pIVar21 != (IdentPtr)0x0 && (byte)local_34 == '\0') {
          local_78 = CreateStrNode(this,pIVar21);
        }
        pMemberName = local_88;
        pOVar23 = (LPCOLESTR)&local_88->field_0x22;
        if (local_88 == (IdentPtr)0x0) {
          pOVar23 = (LPCOLESTR)0x0;
        }
        pPVar17 = ParseFncDeclNoCheckScope<true>
                            (this,(ushort)local_50 + 2 + (ushort)(pIVar22 != pIVar7) * 2,
                             PropertyAllowed,pOVar23,true,false,true);
        pPVar17->fncFlags =
             local_38 << 0x18 |
             pPVar17->fncFlags &
             (kFunctionHasAnyWriteToFormals|kFunctionIsDefaultModuleExport|kFunctionHasDirectSuper|
              kFunctionIsAsync|kFunctionIsDeclaredInParamScope|kFunctionAsmjsMode|
              kFunctionIsGenerator|kFunctionHasDefaultArguments|kFunctionIsGeneratedDefault|
              kFunctionHasHomeObj|kFunctionIsClassMember|kFunctionIsBaseClassConstructor|
              kFunctionIsClassConstructor|kFunctionIsMethod|kFunctionHasSuperReference|
              kFunctionHasNonSimpleParameterList|kFunctionChildCallsEval|kFunctionIsLambda|
              kFunctionHasWithStmt|kFunctionHasComputedName|kFunctionIsModule|
              kFunctionHasDestructuredParams|kFunctionStrictMode|kFunctionHasNonThisStmt|
              kFunctionIsAccessor|kFunctionHasReferenceableBuiltInArguments|
              kFunctionHasHeapArguments|kFunctionUsesArguments|kFunctionCallsEval|
              kFunctionDeclaration|kFunctionNested);
        if ((byte)local_34 != '\0') {
          pbVar2 = (byte *)((long)&pPVar17->fncFlags + 1);
          *pbVar2 = *pbVar2 | 8;
        }
        pPVar17->fncFlags = pPVar17->fncFlags | (kFunctionHasHomeObj|kFunctionIsAccessor);
        local_38 = local_38 & 0xff;
        this_01 = CreateBinNode(this,pIVar22 == pIVar7 | knopSetMember,&local_78->super_ParseNode,
                                &pPVar17->super_ParseNode);
        local_68 = ConstructFinalHintNode
                             (this,pidHint,pMemberName,
                              (&(this->wellKnownPropertyPids).set)[pIVar22 == pIVar7],
                              SUB41(local_38,0),&local_44,&local_48,SUB41(local_34,0),local_68);
      }
      if (local_44 < local_48) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar20 = 1;
        bVar31 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                            ,0x1ff0,"(memberNameHintLength >= memberNameOffset)",
                            "memberNameHintLength >= memberNameOffset");
        if (!bVar31) goto LAB_00e9b589;
        *puVar20 = 0;
      }
      pOVar23 = local_68;
      pPVar24 = ParseNode::AsParseNodeBin(&this_01->super_ParseNode);
      pPVar17 = ParseNode::AsParseNodeFnc(pPVar24->pnode2);
      uVar11 = local_44;
      pPVar17->hint = pOVar23;
      pPVar24 = ParseNode::AsParseNodeBin(&this_01->super_ParseNode);
      pPVar17 = ParseNode::AsParseNodeFnc(pPVar24->pnode2);
      uVar26 = local_48;
      pPVar17->hintLength = uVar11;
      pPVar24 = ParseNode::AsParseNodeBin(&this_01->super_ParseNode);
      pPVar17 = ParseNode::AsParseNodeFnc(pPVar24->pnode2);
      pPVar17->hintOffset = uVar26;
      pPVar24 = ParseNode::AsParseNodeBin(&this_01->super_ParseNode);
      pPVar17 = ParseNode::AsParseNodeFnc(pPVar24->pnode2);
      pPVar17->pid = pIVar21;
      AddToNodeList(this,&local_140,&local_168,&this_01->super_ParseNode);
      pPVar28 = _memberNameOffset;
    }
  } while( true );
}

Assistant:

ParseNodeClass * Parser::ParseClassDecl(BOOL isDeclaration, LPCOLESTR pNameHint, uint32 *pHintLength, uint32 *pShortNameOffset)
{
    bool hasConstructor = false;
    bool hasExtends = false;
    IdentPtr name = nullptr;
    ParseNodeVar * pnodeName = nullptr;
    ParseNodeFnc * pnodeConstructor = nullptr;
    ParseNodePtr pnodeExtends = nullptr;
    ParseNodePtr pnodeMembers = nullptr;
    ParseNodePtr *lastMemberNodeRef = nullptr;
    uint32 nameHintLength = pHintLength ? *pHintLength : 0;
    uint32 nameHintOffset = pShortNameOffset ? *pShortNameOffset : 0;

    ArenaAllocator tempAllocator(_u("ClassMemberNames"), m_nodeAllocator.GetPageAllocator(), Parser::OutOfMemory);

    size_t cbMinConstructor = 0;
    ParseNodeClass * pnodeClass = nullptr;
    if (buildAST)
    {
        pnodeClass = CreateNodeForOpT<knopClassDecl>();

        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Class, m_scriptContext);

        cbMinConstructor = this->GetScanner()->IecpMinTok();
    }

    BOOL strictSave = m_fUseStrictMode;
    m_fUseStrictMode = TRUE;

    this->GetScanner()->Scan();
    if (m_token.tk == tkID)
    {
        name = m_token.GetIdentifier(this->GetHashTbl());
        this->GetScanner()->Scan();
    }
    else if (isDeclaration)
    {
        IdentifierExpectedError(m_token);
    }

    if (isDeclaration && name == wellKnownPropertyPids.arguments && GetCurrentBlockInfo()->pnodeBlock->blockType == Function)
    {
        GetCurrentFunctionNode()->grfpn |= PNodeFlags::fpnArguments_overriddenByDecl;
    }

    ParseNodeVar * pnodeDeclName = nullptr;
    if (isDeclaration)
    {
        pnodeDeclName = CreateBlockScopedDeclNode(name, knopLetDecl);
    }

    ParseNodePtr *ppnodeScopeSave = nullptr;
    ParseNodePtr *ppnodeExprScopeSave = nullptr;

    ParseNodeBlock * pnodeBlock = StartParseBlock<buildAST>(PnodeBlockType::Regular, ScopeType_Block);
    if (buildAST)
    {
        PushFuncBlockScope(pnodeBlock, &ppnodeScopeSave, &ppnodeExprScopeSave);
        pnodeClass->pnodeBlock = pnodeBlock;
    }

    if (name)
    {
        pnodeName = CreateBlockScopedDeclNode(name, knopConstDecl);
    }

    if (m_token.tk == tkEXTENDS)
    {
        this->GetScanner()->Scan();
        pnodeExtends = ParseTerm<buildAST>();
        hasExtends = true;
    }

    if (m_token.tk != tkLCurly)
    {
        Error(ERRnoLcurly);
    }

    OUTPUT_TRACE_DEBUGONLY(Js::ES6VerboseFlag, _u("Parsing class (%s) : %s\n"), GetParseType(), name ? name->Psz() : _u("anonymous class"));

    RestorePoint beginClass;
    this->GetScanner()->Capture(&beginClass);

    this->GetScanner()->ScanForcingPid();

    IdentPtr pClassNamePid = pnodeName ? pnodeName->pid : nullptr;

    for (;;)
    {
        if (m_token.tk == tkSColon)
        {
            this->GetScanner()->ScanForcingPid();
            continue;
        }
        if (m_token.tk == tkRCurly)
        {
            break;
        }

        bool isStatic = false;
        if (m_token.tk == tkSTATIC)
        {
            // 'static' can be used as an IdentifierName here, even in strict mode code. We need to see the next token before we know
            // if this is being used as a keyword. This is similar to the way we treat 'let' in some cases.
            // See https://tc39.github.io/ecma262/#sec-keywords for more info.

            RestorePoint beginStatic;
            this->GetScanner()->Capture(&beginStatic);

            this->GetScanner()->ScanForcingPid();

            if (m_token.tk == tkLParen)
            {
                this->GetScanner()->SeekTo(beginStatic);
            }
            else
            {
                isStatic = true;
            }
        }

        ushort fncDeclFlags = fFncNoName | fFncMethod | fFncClassMember;
        charcount_t ichMin = this->GetScanner()->IchMinTok();
        size_t iecpMin = this->GetScanner()->IecpMinTok();
        ParseNodePtr pnodeMemberName = nullptr;
        IdentPtr pidHint = nullptr;
        IdentPtr memberPid = nullptr;
        bool maybeAccessor = false;
        LPCOLESTR pMemberNameHint = nullptr;
        uint32 memberNameHintLength = 0;
        uint32 memberNameOffset = 0;
        bool isComputedName = false;
        bool isAsyncMethod = false;

        if (CheckContextualKeyword(wellKnownPropertyPids.async) && m_scriptContext->GetConfig()->IsES7AsyncAndAwaitEnabled())
        {
            RestorePoint parsedAsync;
            this->GetScanner()->Capture(&parsedAsync);
            ichMin = this->GetScanner()->IchMinTok();
            iecpMin = this->GetScanner()->IecpMinTok();

            this->GetScanner()->Scan();
            if (m_token.tk == tkLParen || this->GetScanner()->FHadNewLine())
            {
                this->GetScanner()->SeekTo(parsedAsync);
            }
            else
            {
                isAsyncMethod = true;
            }
        }

        bool isGenerator = m_scriptContext->GetConfig()->IsES6GeneratorsEnabled() &&
            m_token.tk == tkStar;
        if (isGenerator)
        {
            fncDeclFlags |= fFncGenerator;
            this->GetScanner()->ScanForcingPid();
        }


        if (m_token.tk == tkLBrack && m_scriptContext->GetConfig()->IsES6ObjectLiteralsEnabled())
        {
            // Computed member name: [expr] () { }
            LPCOLESTR emptyHint = nullptr;
            ParseComputedName<buildAST>(&pnodeMemberName, &emptyHint, &pMemberNameHint, &memberNameHintLength, &memberNameOffset);
            isComputedName = true;
        }
        else // not computed name
        {
            maybeAccessor = !this->GetScanner()->LastIdentifierHasEscape();
            memberPid = this->ParseClassPropertyName(&pidHint);
            if (pidHint)
            {
                pMemberNameHint = pidHint->Psz();
                memberNameHintLength = pidHint->Cch();
            }
        }

        if (buildAST && memberPid)
        {
            pnodeMemberName = CreateStrNode(memberPid);
        }

        if (!isStatic && memberPid == wellKnownPropertyPids.constructor)
        {
            if (hasConstructor || isAsyncMethod)
            {
                Error(ERRsyntax);
            }
            hasConstructor = true;
            LPCOLESTR pConstructorName = nullptr;
            uint32  constructorNameLength = 0;
            uint32  constructorShortNameHintOffset = 0;
            if (pnodeName && pnodeName->pid)
            {
                pConstructorName = pnodeName->pid->Psz();
                constructorNameLength = pnodeName->pid->Cch();
            }
            else
            {
                pConstructorName = pNameHint;
                constructorNameLength = nameHintLength;
                constructorShortNameHintOffset = nameHintOffset;
            }

            {
                SuperRestrictionState::State state = hasExtends ? SuperRestrictionState::CallAndPropertyAllowed : SuperRestrictionState::PropertyAllowed;

                // Add the class constructor flag and base class constructor flag if pnodeExtends is nullptr
                fncDeclFlags |= fFncClassConstructor | (hasExtends ? kFunctionNone : fFncBaseClassConstructor);
                pnodeConstructor = ParseFncDeclNoCheckScope<buildAST>(fncDeclFlags, state, pConstructorName, /* needsPIDOnRCurlyScan */ true);
            }

            if (pnodeConstructor->IsGenerator())
            {
                Error(ERRConstructorCannotBeGenerator);
            }

            Assert(constructorNameLength >= constructorShortNameHintOffset);
            // The constructor function will get the same name as class.
            pnodeConstructor->hint = pConstructorName;
            pnodeConstructor->hintLength = constructorNameLength;
            pnodeConstructor->hintOffset = constructorShortNameHintOffset;
            pnodeConstructor->pid = pnodeName && pnodeName->pid ? pnodeName->pid : wellKnownPropertyPids.constructor;
            pnodeConstructor->SetHasNonThisStmt();
            pnodeConstructor->SetHasHomeObj();
        }
        else
        {
            ParseNodePtr pnodeMember = nullptr;
            RestorePoint beginMethodName;
            this->GetScanner()->Capture(&beginMethodName);

            if (maybeAccessor && (memberPid == wellKnownPropertyPids.get || memberPid == wellKnownPropertyPids.set))
            {
                this->GetScanner()->ScanForcingPid();
            }

            if (m_token.tk == tkLParen)
            {
                this->GetScanner()->SeekTo(beginMethodName);
                maybeAccessor = false;
            }

            if (maybeAccessor && (memberPid == wellKnownPropertyPids.get || memberPid == wellKnownPropertyPids.set))
            {
                bool isGetter = (memberPid == wellKnownPropertyPids.get);

                if (m_token.tk == tkLBrack && m_scriptContext->GetConfig()->IsES6ObjectLiteralsEnabled())
                {
                    // Computed get/set member name: get|set [expr] () { }
                    LPCOLESTR emptyHint = nullptr;
                    ParseComputedName<buildAST>(&pnodeMemberName, &emptyHint, &pMemberNameHint, &memberNameHintLength, &memberNameOffset);
                    isComputedName = true;
                }
                else // not computed name
                {
                    memberPid = this->ParseClassPropertyName(&pidHint);
                }

                if ((isStatic ? (memberPid == wellKnownPropertyPids.prototype) : (memberPid == wellKnownPropertyPids.constructor)) || isAsyncMethod)
                {
                    Error(ERRsyntax);
                }
                if (buildAST && memberPid && !isComputedName)
                {
                    pnodeMemberName = CreateStrNode(memberPid);
                }

                ParseNodeFnc * pnodeFnc = nullptr;
                {
                    pnodeFnc = ParseFncDeclNoCheckScope<buildAST>(fncDeclFlags | (isGetter ? fFncNoArg : fFncOneArg),
                        SuperRestrictionState::PropertyAllowed, pidHint ? pidHint->Psz() : nullptr, /* needsPIDOnRCurlyScan */ true);
                }

                pnodeFnc->SetIsStaticMember(isStatic);
                if (isComputedName)
                {
                    pnodeFnc->SetHasComputedName();
                }
                pnodeFnc->SetHasHomeObj();

                if (buildAST)
                {
                    pnodeFnc->SetIsAccessor();
                    pnodeMember = CreateBinNode(isGetter ? knopGetMember : knopSetMember, pnodeMemberName, pnodeFnc);
                    pMemberNameHint = ConstructFinalHintNode(pClassNamePid, pidHint,
                        isGetter ? wellKnownPropertyPids.get : wellKnownPropertyPids.set, isStatic,
                        &memberNameHintLength, &memberNameOffset, isComputedName, pMemberNameHint);
                }
            }
            else
            {
                if (isStatic && (memberPid == wellKnownPropertyPids.prototype))
                {
                    Error(ERRsyntax);
                }

                ParseNodeFnc * pnodeFnc = nullptr;
                {
                    if (isAsyncMethod)
                    {
                        fncDeclFlags |= fFncAsync;
                    }
                    pnodeFnc = ParseFncDeclNoCheckScope<buildAST>(fncDeclFlags, SuperRestrictionState::PropertyAllowed, pidHint ? pidHint->Psz() : nullptr, /* needsPIDOnRCurlyScan */ true);

                    if (isAsyncMethod || isGenerator || isComputedName)
                    {
                        pnodeFnc->cbStringMin = iecpMin;
                        pnodeFnc->cbStringLim = pnodeFnc->cbLim;
                    }
                }
                pnodeFnc->SetIsStaticMember(isStatic);
                if (isComputedName)
                {
                    pnodeFnc->SetHasComputedName();
                }
                pnodeFnc->SetHasHomeObj();

                if (buildAST)
                {
                    pnodeMember = CreateBinNode(knopMember, pnodeMemberName, pnodeFnc);
                    pMemberNameHint = ConstructFinalHintNode(pClassNamePid, pidHint, nullptr /*pgetset*/, isStatic, &memberNameHintLength, &memberNameOffset, isComputedName, pMemberNameHint);
                }
            }

            if (buildAST)
            {
                Assert(memberNameHintLength >= memberNameOffset);
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->hint = pMemberNameHint; // Fully qualified name
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->hintLength = memberNameHintLength;
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->hintOffset = memberNameOffset;
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->pid = memberPid; // Short name

                AddToNodeList(&pnodeMembers, &lastMemberNodeRef, pnodeMember);
            }
        }
    }

    size_t cbLimConstructor = 0;
    if (buildAST)
    {
        pnodeClass->ichLim = this->GetScanner()->IchLimTok();
        cbLimConstructor = this->GetScanner()->IecpLimTok();
    }

    if (!hasConstructor)
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ES6VerboseFlag, _u("Generating constructor (%s) : %s\n"), GetParseType(), name ? name->Psz() : _u("anonymous class"));

        RestorePoint endClass;
        this->GetScanner()->Capture(&endClass);
        this->GetScanner()->SeekTo(beginClass);

        pnodeConstructor = GenerateEmptyConstructor<buildAST>(pnodeExtends != nullptr);

        if (buildAST)
        {
            if (pClassNamePid)
            {
                pnodeConstructor->hint = pClassNamePid->Psz();
                pnodeConstructor->hintLength = pClassNamePid->Cch();
                pnodeConstructor->hintOffset = 0;
            }
            else
            {
                Assert(nameHintLength >= nameHintOffset);
                pnodeConstructor->hint = pNameHint;
                pnodeConstructor->hintLength = nameHintLength;
                pnodeConstructor->hintOffset = nameHintOffset;
            }
            pnodeConstructor->pid = pClassNamePid;
        }

        this->GetScanner()->SeekTo(endClass);
    }

    if (buildAST)
    {
        pnodeConstructor->cbStringMin = cbMinConstructor;
        pnodeConstructor->cbStringLim = cbLimConstructor;

        PopFuncBlockScope(ppnodeScopeSave, ppnodeExprScopeSave);

        pnodeClass->pnodeDeclName = pnodeDeclName;
        pnodeClass->pnodeName = pnodeName;
        pnodeClass->pnodeConstructor = pnodeConstructor;
        pnodeClass->pnodeExtends = pnodeExtends;
        pnodeClass->pnodeMembers = pnodeMembers;
        pnodeClass->isDefaultModuleExport = false;
    }
    FinishParseBlock(pnodeBlock);

    m_fUseStrictMode = strictSave;

    this->GetScanner()->Scan();

    return pnodeClass;
}